

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

void __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::dump(olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
       *this,ostream *os)

{
  ostream *poVar1;
  __int_type _Var2;
  basic_node_ptr<unodb::detail::olc_node_header> local_20;
  ostream *local_18;
  ostream *os_local;
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  poVar1 = std::operator<<(os,"olc_db dump, current memory use = ");
  _Var2 = get_current_memory_use(this);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,_Var2);
  std::operator<<(poVar1,'\n');
  poVar1 = local_18;
  local_20 = in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::
             load(&this->root);
  detail::
  basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
  ::dump_node(poVar1,&local_20,true);
  return;
}

Assistant:

void olc_db<Key, Value>::dump(std::ostream& os) const {
#ifdef UNODB_DETAIL_WITH_STATS
  os << "olc_db dump, current memory use = " << get_current_memory_use()
     << '\n';
#else
  os << "olc_db dump\n";
#endif  // UNODB_DETAIL_WITH_STATS
  art_policy::dump_node(os, root.load());
}